

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

attr_list attr_join_lists(attr_list list1,attr_list list2)

{
  attr_list *pp_Var1;
  long in_RSI;
  attr_list in_RDI;
  attr_list list;
  attr_list local_8;
  
  if (in_RSI == 0) {
    in_RDI->ref_count = in_RDI->ref_count + 1;
    local_8 = in_RDI;
  }
  else {
    local_8 = (attr_list)malloc(0x18);
    init_global_atom_server((atom_server *)0x104d11);
    local_8->list_of_lists = 1;
    local_8->ref_count = 1;
    pp_Var1 = (attr_list *)malloc(0x10);
    (local_8->l).lists.lists = pp_Var1;
    (local_8->l).lists.sublist_count = 2;
    *(local_8->l).lists.lists = in_RDI;
    in_RDI->ref_count = in_RDI->ref_count + 1;
    *(long *)&((local_8->l).list.iattrs)->iattr[0].value = in_RSI;
    *(short *)(in_RSI + 2) = *(short *)(in_RSI + 2) + 1;
  }
  return local_8;
}

Assistant:

extern attr_list
attr_join_lists(attr_list list1, attr_list list2)
{
    attr_list list;

    if (list2 == NULL) {
        list1->ref_count++;
        return list1;
    }
    list = malloc(sizeof(attr_list_struct));

    init_global_atom_server(&global_as);
    list->list_of_lists = 1;
    list->ref_count = 1;
    list->l.lists.lists = (attr_list *)malloc(sizeof(attr_list) *2);
    list->l.lists.sublist_count = 2;
    list->l.lists.lists[0] = list1;
    list1->ref_count++;
    list->l.lists.lists[1] = list2;
    list2->ref_count++;
    return list;     
}